

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_avx2_256_64.c
# Opt level: O3

parasail_result_t *
parasail_sw_table_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  longlong *plVar1;
  undefined4 uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  __m256i alVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  __m256i c;
  parasail_result_t *ppVar18;
  __m256i *palVar19;
  __m256i *ptr;
  __m256i *b;
  __m256i *__dest;
  __m256i *ptr_00;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  int iVar35;
  __m256i *palVar36;
  uint uVar37;
  long lVar38;
  uint uVar39;
  ulong size;
  long lVar40;
  uint a;
  bool bVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 in_stack_fffffffffffffde8 [12];
  undefined4 in_stack_fffffffffffffdf4;
  int iVar54;
  undefined1 auVar50 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_scan_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sw_table_scan_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_scan_profile_avx2_256_64_cold_6();
      }
      else {
        uVar37 = profile->s1Len;
        uVar26 = (ulong)uVar37;
        if ((int)uVar37 < 1) {
          parasail_sw_table_scan_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_scan_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_table_scan_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_sw_table_scan_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_table_scan_profile_avx2_256_64_cold_1();
        }
        else {
          uVar32 = uVar26 + 3;
          uVar28 = CONCAT44(0,open);
          iVar54 = ppVar4->min;
          uVar34 = 0x8000000000000000 - (long)iVar54;
          if (iVar54 != -open && SBORROW4(iVar54,-open) == iVar54 + open < 0) {
            uVar34 = uVar28 | 0x8000000000000000;
          }
          iVar54 = ppVar4->max;
          a = (uint)uVar32 & 0x7ffffffc;
          ppVar18 = parasail_result_new_table1(a,s2Len);
          if (ppVar18 != (parasail_result_t *)0x0) {
            size = uVar32 >> 2;
            ppVar18->flag = ppVar18->flag | 0x4820404;
            palVar19 = parasail_memalign___m256i(0x20,size);
            ptr = parasail_memalign___m256i(0x20,size);
            b = parasail_memalign___m256i(0x20,size);
            __dest = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign___m256i(0x20,size);
            if (ptr_00 != (__m256i *)0x0 &&
                ((__dest != (__m256i *)0x0 && b != (__m256i *)0x0) &&
                (ptr != (__m256i *)0x0 && palVar19 != (__m256i *)0x0))) {
              auVar43._4_4_ = 0;
              auVar43._0_4_ = gap;
              auVar43._8_4_ = gap;
              auVar43._12_4_ = 0;
              auVar43._16_4_ = gap;
              auVar43._20_4_ = 0;
              auVar43._24_4_ = gap;
              auVar43._28_4_ = 0;
              uVar34 = uVar34 + 1;
              lVar33 = 0x7ffffffffffffffe - (long)iVar54;
              uVar39 = (uint)size;
              lVar23 = (long)(int)-(gap * uVar39);
              auVar44._8_8_ = lVar23;
              auVar44._0_8_ = lVar23;
              auVar44._16_8_ = lVar23;
              auVar44._24_8_ = lVar23;
              auVar44 = vpblendd_avx2(auVar44,SUB6432(ZEXT1664((undefined1  [16])0x0),0),3);
              auVar44 = vpaddq_avx2(ZEXT832(uVar34),auVar44);
              alVar15[1]._4_4_ = in_stack_fffffffffffffdf4;
              alVar15._0_12_ = in_stack_fffffffffffffde8;
              alVar15[2] = (longlong)palVar19;
              alVar15[3] = uVar34;
              palVar36 = palVar19;
              uVar21 = uVar34;
              parasail_memset___m256i(b,alVar15,size);
              c[1]._4_4_ = in_stack_fffffffffffffdf4;
              c._0_12_ = in_stack_fffffffffffffde8;
              c[2] = (longlong)palVar36;
              c[3] = uVar21;
              parasail_memset___m256i(palVar19,c,size);
              auVar9._8_4_ = open;
              auVar9._0_8_ = uVar28;
              auVar9._12_4_ = 0;
              auVar9._16_4_ = open;
              auVar9._20_4_ = 0;
              auVar9._24_4_ = open;
              auVar9._28_4_ = 0;
              auVar52 = ZEXT3264(auVar9);
              alVar15 = (__m256i)vpsubq_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar9);
              palVar19 = ptr_00 + (uVar39 - 1);
              uVar20 = size;
              do {
                *palVar19 = alVar15;
                alVar15 = (__m256i)vpsubq_avx2((undefined1  [32])alVar15,auVar43);
                palVar19 = palVar19 + -1;
                iVar54 = (int)uVar20;
                uVar27 = iVar54 - 1;
                uVar20 = (ulong)uVar27;
              } while (uVar27 != 0 && 0 < iVar54);
              uVar20 = (ulong)(uint)s2Len;
              lVar40 = (ulong)(uVar39 + (uVar39 == 0)) << 5;
              lVar23 = size * uVar20;
              lVar38 = 0;
              uVar25 = 0;
              iVar54 = 0;
              auVar8._8_8_ = uVar34;
              auVar8._0_8_ = uVar34;
              auVar8._16_8_ = uVar34;
              auVar8._24_8_ = uVar34;
              auVar53 = ZEXT3264(auVar8);
              auVar7._8_8_ = lVar33;
              auVar7._0_8_ = lVar33;
              auVar7._16_8_ = lVar33;
              auVar7._24_8_ = lVar33;
              palVar19 = palVar36;
              auVar9 = auVar8;
              do {
                iVar35 = ppVar4->mapper[(byte)s2[uVar25]];
                alVar15 = b[uVar39 - 1];
                auVar50 = vperm2i128_avx2((undefined1  [32])alVar15,(undefined1  [32])alVar15,8);
                auVar50 = vpalignr_avx2((undefined1  [32])alVar15,auVar50,8);
                lVar29 = 0;
                auVar6._8_8_ = uVar34;
                auVar6._0_8_ = uVar34;
                auVar6._16_8_ = uVar34;
                auVar6._24_8_ = uVar34;
                auVar45 = ZEXT1664((undefined1  [16])0x0);
                do {
                  auVar12 = vpaddq_avx2(auVar50,*(undefined1 (*) [32])
                                                 ((long)pvVar3 + lVar29 + (long)iVar35 * size * 0x20
                                                 ));
                  auVar50 = *(undefined1 (*) [32])((long)*b + lVar29);
                  auVar16 = vpsubq_avx2(*(undefined1 (*) [32])((long)*palVar36 + lVar29),auVar43);
                  auVar13 = vpaddq_avx2(auVar45._0_32_,
                                        *(undefined1 (*) [32])((long)*ptr_00 + lVar29));
                  auVar17 = vpsubq_avx2(auVar50,auVar52._0_32_);
                  auVar14 = vpcmpgtq_avx2(auVar6,auVar13);
                  auVar6 = vblendvpd_avx(auVar13,auVar6,auVar14);
                  auVar13 = vpcmpgtq_avx2(auVar16,auVar17);
                  auVar13 = vblendvpd_avx(auVar17,auVar16,auVar13);
                  auVar14 = vpcmpgtq_avx2(auVar13,auVar12);
                  auVar12 = vblendvpd_avx(auVar12,auVar13,auVar14);
                  auVar45 = ZEXT3264(auVar12);
                  *(undefined1 (*) [32])((long)*palVar36 + lVar29) = auVar13;
                  *(undefined1 (*) [32])((long)*ptr + lVar29) = auVar12;
                  lVar29 = lVar29 + 0x20;
                } while (lVar40 != lVar29);
                auVar50 = vperm2f128_avx(auVar12,auVar12,8);
                auVar13 = vpalignr_avx2(auVar12,auVar50,8);
                auVar50 = vpaddq_avx2(auVar13,(undefined1  [32])*ptr_00);
                auVar12 = vpcmpgtq_avx2(auVar6,auVar50);
                auVar50 = vblendvpd_avx(auVar50,auVar6,auVar12);
                bVar41 = true;
                do {
                  bVar22 = bVar41;
                  auVar6 = vperm2f128_avx(auVar50,auVar50,8);
                  auVar6 = vpalignr_avx2(auVar50,auVar6,8);
                  auVar6 = vpaddq_avx2(auVar44,auVar6);
                  auVar12 = vpcmpgtq_avx2(auVar50,auVar6);
                  auVar50 = vblendvpd_avx(auVar6,auVar50,auVar12);
                  bVar41 = false;
                } while (bVar22);
                auVar6 = vperm2f128_avx(auVar50,auVar50,8);
                auVar50 = vpalignr_avx2(auVar50,auVar6,8);
                auVar6 = vpaddq_avx2(auVar50,ZEXT832(uVar34));
                auVar50 = vpcmpgtq_avx2(auVar13,auVar6);
                auVar50 = vblendvpd_avx(auVar6,auVar13,auVar50);
                auVar13 = vpcmpgtq_avx2(auVar50,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                auVar50 = vpand_avx2(auVar13,auVar50);
                lVar30 = 0;
                lVar29 = lVar38;
                do {
                  auVar6 = vpsubq_avx2(auVar6,auVar43);
                  auVar13 = vpsubq_avx2(auVar50,auVar52._0_32_);
                  auVar50 = vpcmpgtq_avx2(auVar6,auVar13);
                  auVar6 = vblendvpd_avx(auVar13,auVar6,auVar50);
                  auVar50 = *(undefined1 (*) [32])((long)*ptr + lVar30);
                  auVar13 = vpcmpgtq_avx2(auVar50,auVar6);
                  auVar50 = vblendvpd_avx(auVar6,auVar50,auVar13);
                  auVar13 = vpcmpgtq_avx2(auVar50,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  auVar50 = vpand_avx2(auVar13,auVar50);
                  *(undefined1 (*) [32])((long)*b + lVar30) = auVar50;
                  auVar13 = vpcmpgtq_avx2(auVar50,auVar7);
                  auVar7 = vblendvpd_avx(auVar50,auVar7,auVar13);
                  auVar13 = vpcmpgtq_avx2(auVar8,auVar50);
                  auVar8 = vblendvpd_avx(auVar50,auVar8,auVar13);
                  piVar5 = ((ppVar18->field_4).rowcols)->score_row;
                  *(int *)((long)piVar5 + lVar29) = auVar50._0_4_;
                  *(int *)((long)piVar5 + lVar23 * 4 + lVar29) = auVar50._8_4_;
                  *(int *)((long)piVar5 + lVar23 * 8 + lVar29) = auVar50._16_4_;
                  uVar2 = vextractps_avx(auVar50._16_16_,2);
                  *(undefined4 *)((long)piVar5 + lVar23 * 0xc + lVar29) = uVar2;
                  auVar13 = vpcmpgtq_avx2(auVar50,auVar9);
                  auVar9 = vblendvpd_avx(auVar9,auVar50,auVar13);
                  lVar30 = lVar30 + 0x20;
                  lVar29 = lVar29 + uVar20 * 4;
                } while (lVar40 != lVar30);
                auVar50 = vpcmpgtq_avx2(auVar9,auVar53._0_32_);
                if ((((auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     SUB321(auVar50 >> 0x7f,0) != '\0') || SUB321(auVar50 >> 0xbf,0) != '\0') ||
                    auVar50[0x1f] < '\0') {
                  uVar21 = auVar9._0_8_;
                  if (auVar9._0_8_ < auVar9._16_8_) {
                    uVar21 = auVar9._16_8_;
                  }
                  uVar31 = vpextrq_avx(auVar9._0_16_,1);
                  uVar24 = vpextrq_avx(auVar9._16_16_,1);
                  if (uVar31 < uVar24) {
                    uVar31 = uVar24;
                  }
                  if ((long)uVar31 <= (long)uVar21) {
                    uVar31 = uVar21;
                  }
                  palVar36 = palVar19;
                  uVar21 = uVar31;
                  memcpy(__dest,b,size << 5);
                  auVar53 = ZEXT3264(CONCAT824(uVar31,CONCAT816(uVar31,CONCAT88(uVar31,uVar31))));
                  auVar52 = ZEXT2864(CONCAT424(open,CONCAT420(0,CONCAT416(open,CONCAT412(0,CONCAT48(
                                                  open,uVar28))))));
                  iVar54 = (int)uVar25;
                  palVar19 = palVar36;
                }
                uVar25 = uVar25 + 1;
                lVar38 = lVar38 + 4;
              } while (uVar25 != uVar20);
              bVar41 = (uVar32 & 0x7ffffffc) == 0;
              if (!bVar41) {
                if (bVar41) {
                  uVar32 = 0;
                  do {
                    if (((*__dest)[uVar32] == uVar21) &&
                       (uVar37 = ((uint)uVar32 & 3) * uVar39 | (uint)(uVar32 >> 2) & 0x3fffffff,
                       (int)uVar37 < (int)uVar26)) {
                      uVar26 = (ulong)uVar37;
                    }
                    uVar37 = (uint)uVar26;
                    uVar32 = uVar32 + 1;
                  } while ((uVar39 & 0x1fffffff) << 2 != (int)uVar32);
                }
                else {
                  auVar42._4_4_ = uVar37;
                  auVar42._0_4_ = uVar37;
                  auVar42._8_4_ = uVar37;
                  auVar42._12_4_ = uVar37;
                  auVar46._4_4_ = uVar39;
                  auVar46._0_4_ = uVar39;
                  auVar46._8_4_ = uVar39;
                  auVar46._12_4_ = uVar39;
                  auVar11 = vpmovsxbd_avx(ZEXT416(0x3020100));
                  uVar26 = 0;
                  auVar47._8_4_ = 3;
                  auVar47._0_8_ = 0x300000003;
                  auVar47._12_4_ = 3;
                  auVar48._8_4_ = 4;
                  auVar48._0_8_ = 0x400000004;
                  auVar48._12_4_ = 4;
                  do {
                    plVar1 = *__dest + uVar26;
                    auVar49._0_8_ = -(ulong)(uVar21 == *plVar1);
                    auVar49._8_8_ = -(ulong)(uVar21 == plVar1[1]);
                    auVar50._16_8_ = -(ulong)(uVar21 == SUB248(*(undefined1 (*) [24])plVar1,0x10));
                    auVar50._0_16_ = auVar49;
                    auVar50._24_8_ = -(ulong)(uVar21 == plVar1[3]);
                    auVar49 = vpackssdw_avx(auVar49,auVar50._16_16_);
                    auVar51 = vpsrld_avx(auVar11,2);
                    auVar10 = vpand_avx(auVar11,auVar47);
                    auVar10 = vpmulld_avx(auVar10,auVar46);
                    auVar10 = vpaddd_avx(auVar10,auVar51);
                    auVar10 = vpminsd_avx(auVar10,auVar42);
                    auVar42 = vblendvps_avx(auVar42,auVar10,auVar49);
                    uVar26 = uVar26 + 4;
                    auVar11 = vpaddd_avx(auVar11,auVar48);
                  } while (a != uVar26);
                  auVar11 = vpshufd_avx(auVar42,0xee);
                  auVar42 = vpminsd_avx(auVar42,auVar11);
                  auVar11 = vpshufd_avx(auVar42,0x55);
                  auVar42 = vpminsd_avx(auVar42,auVar11);
                  uVar37 = auVar42._0_4_;
                }
              }
              iVar35 = (int)uVar21;
              auVar13._8_8_ = uVar34;
              auVar13._0_8_ = uVar34;
              auVar13._16_8_ = uVar34;
              auVar13._24_8_ = uVar34;
              auVar44 = vpcmpgtq_avx2(auVar13,auVar7);
              auVar12._8_8_ = lVar33;
              auVar12._0_8_ = lVar33;
              auVar12._16_8_ = lVar33;
              auVar12._24_8_ = lVar33;
              auVar9 = vpcmpgtq_avx2(auVar8,auVar12);
              auVar44 = vpor_avx2(auVar9,auVar44);
              if ((((auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   SUB321(auVar44 >> 0x7f,0) != '\0') || SUB321(auVar44 >> 0xbf,0) != '\0') ||
                  auVar44[0x1f] < '\0') {
                *(byte *)&ppVar18->flag = (byte)ppVar18->flag | 0x40;
                iVar35 = 0;
                iVar54 = 0;
                uVar37 = 0;
              }
              ppVar18->score = iVar35;
              ppVar18->end_query = uVar37;
              ppVar18->end_ref = iVar54;
              parasail_free(ptr_00);
              parasail_free(__dest);
              parasail_free(b);
              parasail_free(ptr);
              parasail_free(palVar19);
              return ppVar18;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m256i(pvH, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vE, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vHp = _mm256_add_epi64(vHp, vW);
            vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[i]));
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            vF = _mm256_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        vH = _mm256_max_epi64_rpl(vHt, vF);
        vH = _mm256_max_epi64_rpl(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vF, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vH = _mm256_max_epi64_rpl(vHt, vF);
            vH = _mm256_max_epi64_rpl(vH, vZero);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
        } 

        {
            __m256i vCompare = _mm256_cmpgt_epi64(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi64_rpl(vMaxH);
                vMaxHUnit = _mm256_set1_epi64x_rpl(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m256i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m256i vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int64_t *t = (int64_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}